

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

RGB colorOfPoint(Point *point,Triangle *triangle)

{
  RGB RVar1;
  RGB RVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector VVar4;
  Vector local_118;
  Vector local_108;
  Vector local_f8;
  Vector local_e8;
  Vector local_d8;
  Vector local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  local_b8._0_4_ = (triangle->x).x;
  local_b8._4_4_ = (triangle->x).y;
  local_2c = (triangle->x).z;
  local_48._0_4_ = (triangle->y).x;
  local_48._4_4_ = (triangle->y).y;
  uStack_40 = 0;
  local_20 = (triangle->y).z;
  local_78._0_4_ = (triangle->z).x;
  local_78._4_4_ = (triangle->z).y;
  local_24 = (triangle->z).z;
  uStack_b0 = 0;
  local_118.z = local_20 - local_2c;
  local_118.y = (float)local_48._4_4_ - (float)local_b8._4_4_;
  local_118.x = (float)local_48 - (float)local_b8;
  uStack_70 = 0;
  local_108.z = local_24 - local_2c;
  local_108.y = (float)local_78._4_4_ - (float)local_b8._4_4_;
  local_108.x = (float)local_78 - (float)local_b8;
  local_a8 = (float)local_b8._4_4_;
  fStack_a4 = (float)local_b8._4_4_;
  fStack_a0 = (float)local_b8._4_4_;
  fStack_9c = (float)local_b8._4_4_;
  local_98 = (float)local_48._4_4_;
  fStack_94 = (float)local_48._4_4_;
  fStack_90 = (float)local_48._4_4_;
  fStack_8c = (float)local_48._4_4_;
  local_68 = (float)local_78._4_4_;
  fStack_64 = (float)local_78._4_4_;
  fStack_60 = (float)local_78._4_4_;
  fStack_5c = (float)local_78._4_4_;
  VVar4 = crossProduct(&local_118,&local_108);
  local_1c = VVar4.z;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = VVar4._0_8_;
  local_58._12_4_ = extraout_XMM0_Dd;
  local_30 = local_1c * local_1c + VVar4.x * VVar4.x + VVar4.y * VVar4.y;
  local_f8.z = local_24 - local_20;
  local_f8.y = local_68 - local_98;
  local_f8.x = (float)local_78 - (float)local_48;
  local_88._0_4_ = point->x;
  local_88._4_4_ = point->y;
  uStack_80 = 0;
  local_28 = point->z;
  fVar3 = (float)local_88 - (float)local_48;
  local_48 = CONCAT44(local_88._4_4_,local_88._4_4_);
  uStack_40 = CONCAT44(local_88._4_4_,local_88._4_4_);
  local_e8.z = local_28 - local_20;
  local_e8.y = (float)local_88._4_4_ - local_98;
  local_e8.x = fVar3;
  VVar4 = crossProduct(&local_f8,&local_e8);
  local_20 = VVar4.z * local_1c + VVar4.x * (float)local_58._0_4_ + (float)local_58._4_4_ * VVar4.y;
  local_d8.z = local_2c - local_24;
  local_d8.y = local_a8 - local_68;
  local_d8.x = (float)local_b8 - (float)local_78;
  local_c8.z = local_28 - local_24;
  local_c8.y = (float)local_48 - local_68;
  local_c8.x = (float)local_88 - (float)local_78;
  VVar4 = crossProduct(&local_d8,&local_c8);
  local_20 = local_20 / local_30;
  local_1c = (VVar4.z * local_1c + (float)local_58._0_4_ * VVar4.x + (float)local_58._4_4_ * VVar4.y
             ) / local_30;
  RVar1 = operator*(triangle->colorX,local_20);
  RVar2 = operator*(triangle->colorY,local_1c);
  RVar1 = operator+(RVar1,RVar2);
  RVar2 = operator*(triangle->colorZ,(1.0 - local_20) - local_1c);
  RVar1 = operator+(RVar1,RVar2);
  return RVar1;
}

Assistant:

RGB colorOfPoint(Point const& point, Triangle const& triangle)
{
  float u;
  float v;

  Point v0 = triangle.x;
  Point v1 = triangle.y;
  Point v2 = triangle.z;

  Vector v0v1 = v1 - v0;
  Vector v0v2 = v2 - v0;

  Vector N = crossProduct(v0v1, v0v2);
  float denom = dotProduct(N, N);

  Vector C;

  Vector edge1 = v2 - v1;
  Vector vp1 = point - v1;
  C = crossProduct(edge1, vp1);
  u = dotProduct(N, C);

  Vector edge2 = v0 - v2;
  Vector vp2 = point - v2;
  C = crossProduct(edge2, vp2);
  v = dotProduct(N, C);

  u /= denom;
  v /= denom;

  return triangle.colorX * u + triangle.colorY * v + triangle.colorZ * (1 - u - v);
}